

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O1

void Eso_ManStop(Eso_Man_t *p)

{
  Vec_Wec_t *pVVar1;
  void *pvVar2;
  Hsh_VecMan_t *__ptr;
  Vec_Int_t *pVVar3;
  long lVar4;
  long lVar5;
  
  pVVar1 = p->vEsops;
  if (0 < pVVar1->nCap) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar1->pArray->nCap + lVar5);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar1->pArray->nCap + lVar5) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < pVVar1->nCap);
  }
  if (pVVar1->pArray != (Vec_Int_t *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (Vec_Int_t *)0x0;
  }
  pVVar1->nCap = 0;
  pVVar1->nSize = 0;
  free(pVVar1);
  __ptr = p->pHash;
  pVVar3 = __ptr->vTable;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = __ptr->vData;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = __ptr->vMap;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  free(__ptr);
  pVVar1 = p->vCubes;
  if (0 < pVVar1->nCap) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar1->pArray->nCap + lVar5);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar1->pArray->nCap + lVar5) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < pVVar1->nCap);
  }
  if (pVVar1->pArray != (Vec_Int_t *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (Vec_Int_t *)0x0;
  }
  pVVar1->nCap = 0;
  pVVar1->nSize = 0;
  free(pVVar1);
  pVVar3 = p->vCube1;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vCube2;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vCube;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  if (p != (Eso_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Eso_ManStop( Eso_Man_t * p )
{
    Vec_WecFree( p->vEsops );
    Hsh_VecManStop( p->pHash );
    Vec_WecFree( p->vCubes );
    Vec_IntFree( p->vCube1 );
    Vec_IntFree( p->vCube2 );
    Vec_IntFree( p->vCube );
    ABC_FREE( p );
}